

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupReplaceCut(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  Gia_ManHighLightFlopLogic(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < p->nObjs) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar14 + -8);
      uVar10 = uVar4 & 0x1fffffff;
      if (((uint)uVar4 & 0xc0000000) == 0x40000000 && uVar10 != 0x1fffffff) {
        iVar7 = (int)uVar10;
        if (((*(byte *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar7 * 4) * -3 + -5) & 0x40) == 0) &&
           (uVar6 = iVar7 << 2, *(int *)((long)pGVar3 + lVar14 + (ulong)uVar6 * -3) == -1)) {
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001f67e2;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001f67e2;
          *(int *)((long)pGVar3 + lVar14 + (ulong)uVar6 * -3) =
               (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
        }
        uVar6 = *(uint *)((long)pGVar3 + lVar14 + -4) & 0x1fffffff;
        if (((*(byte *)((long)pGVar3 + (ulong)(uVar6 * 4) * -3 + lVar14 + -5) & 0x40) == 0) &&
           (uVar6 = uVar6 << 2, *(int *)((long)pGVar3 + lVar14 + (ulong)uVar6 * -3) == -1)) {
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001f67e2;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001f67e2;
          *(int *)((long)pGVar3 + lVar14 + (ulong)uVar6 * -3) =
               (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
        }
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar13 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar6 = (iVar1 - iVar7) + iVar13;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCis->pArray[uVar6];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001f6801;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_001f67e2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001f67e2;
      pGVar3[iVar7].Value = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      iVar13 = iVar13 + 1;
      iVar7 = p->nRegs;
    } while (iVar13 < iVar7);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar14];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001f6801:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar7);
      lVar14 = lVar14 + 1;
      pVVar12 = p->vCos;
    } while (lVar14 < pVVar12->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p )
{
    Gia_Man_t * pNew;  int i;
    Gia_Obj_t * pObj, * pFanin;
    Gia_ManHighLightFlopLogic( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs for nodes pointed to from above the cut
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fMark0 )
            continue;
        pFanin = Gia_ObjFanin0(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
        pFanin = Gia_ObjFanin1(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
    }
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManCleanMark0( p );
    return pNew;
}